

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O0

void __thiscall
CQueue::
AddToQueue<int(*)(char_data*,char_data*,int,int,bool,int,int,std::__cxx11::string),char_data*&,char_data*&,int&,int,int,int,int,char_const(&)[18]>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_int_char_data_ptr_char_data_ptr_int_int_bool_int_int_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          *func,char_data **args,char_data **args_1,int *args_2,int *args_3,int *args_4,int *args_5,
          int *args_6,char (*args_7) [18])

{
  string_view fmt;
  string_view fmt_00;
  string *in_RCX;
  string *in_RDX;
  int in_ESI;
  CLogger *in_RDI;
  value_type *in_stack_00000028;
  queueEntry_t *in_stack_00000030;
  anon_class_64_9_5b8487c2 *in_stack_00000038;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  tuple<char_data_*&,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]> tuple;
  char *in_stack_fffffffffffffe28;
  anon_class_64_9_5b8487c2 *__f;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe30;
  function<void_()> *this_00;
  int *in_stack_fffffffffffffe38;
  tuple<char_data_*&,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>
  *in_stack_fffffffffffffe40;
  CQueue *in_stack_fffffffffffffe48;
  long lVar1;
  char_data **in_stack_fffffffffffffe50;
  int *args_2_00;
  CLogger *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1_00;
  size_t in_stack_fffffffffffffe60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  char *in_stack_fffffffffffffe68;
  int *in_stack_fffffffffffffe70;
  string *this_01;
  undefined1 auStack_134 [36];
  int local_110;
  string local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  int local_c8 [6];
  function<void_()> fStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined8 local_48;
  int local_c;
  
  local_c = in_ESI;
  if (in_ESI < 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    local_48 = 8;
    fmt._M_str = in_stack_fffffffffffffe68;
    fmt._M_len = in_stack_fffffffffffffe60;
    CLogger::Warn<unsigned_long>
              (in_stack_fffffffffffffe58,fmt,(unsigned_long *)in_stack_fffffffffffffe50);
  }
  args_00 = &local_78;
  __f = in_stack_00000038;
  std::tuple<char_data_*&,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]>::
  tuple<char_data_*&,_char_data_*&,_int_&,_int_&,_int_&,_int_&,_int_&,_const_char_(&)[18],_true,_true>
            ((tuple<char_data_*&,_char_data_*&,_int_&,_int,_int,_int,_int,_const_char_(&)[18]> *)
             in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
             (char_data **)in_stack_fffffffffffffe48,(int *)in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe38,(int *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe70,
             (int *)in_RCX,(char (*) [18])in_RDX);
  GetCharacterData<char_data*&,char_data*&,int&,int,int,int,int,char_const(&)[18]>
            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  local_110 = local_c;
  this_01 = local_108;
  std::__cxx11::string::string(this_01,in_RDX);
  args_1_00 = &local_e8;
  std::__cxx11::string::string((string *)args_1_00,in_RCX);
  args_2_00 = local_c8;
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector
            ((vector<char_data_*,_std::allocator<char_data_*>_> *)this_01,
             (vector<char_data_*,_std::allocator<char_data_*>_> *)in_RDI);
  this_00 = &fStack_b0;
  lVar1 = 0;
  do {
    auStack_134[lVar1] = *(undefined1 *)((long)&in_stack_00000038->func + lVar1);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x12);
  std::function<void()>::
  function<CQueue::AddToQueue<int(*)(char_data*,char_data*,int,int,bool,int,int,std::__cxx11::string),char_data*&,char_data*&,int&,int,int,int,int,char_const(&)[18]>(int,std::__cxx11::string,std::__cxx11::string,int(*)(char_data*,char_data*,int,int,bool,int,int,std::__cxx11::string),char_data*&,char_data*&,int&,int&&,int&&,int&&,int&&,char_const(&)[18])::_lambda()_1_,void>
            (this_00,__f);
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::push_back
            ((vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_> *)
             in_stack_00000030,in_stack_00000028);
  queueEntry_t::~queueEntry_t(in_stack_00000030);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,(char *)__f);
  fmt_00._M_str = (char *)in_RCX;
  fmt_00._M_len = (size_t)this_01;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            (in_RDI,fmt_00,args_00,args_1_00,args_2_00);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::~vector
            ((vector<char_data_*,_std::allocator<char_data_*>_> *)this_00);
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}